

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unpacked_star_expression.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::ReplaceUnpackedStarExpression
          (Binder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,expression_list_t *star_list,StarExpression *star,
          optional_ptr<duckdb_re2::RE2,_true> regex)

{
  ExpressionClass EVar1;
  ExpressionType EVar2;
  pointer pOVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  pointer pEVar6;
  pointer pEVar7;
  bool bVar8;
  pointer pPVar9;
  BaseExpression *pBVar10;
  FunctionExpression *pFVar11;
  OperatorExpression *pOVar12;
  reference pvVar13;
  pointer pOVar14;
  reference pvVar15;
  reference pvVar16;
  type pPVar17;
  BinderException *pBVar18;
  NotImplementedException *this_00;
  OrderByNode *order;
  pointer pOVar19;
  pointer puVar20;
  unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> *this_01;
  size_type __n;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  size_type __n_00;
  pointer child_00;
  initializer_list<duckdb::ExpressionType> __l;
  expression_list_t new_orders;
  expression_list_t new_children;
  vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_> local_b8;
  _Any_data local_98;
  pointer local_88;
  code *local_80;
  string local_78;
  Binder *local_50;
  StarExpression *local_48;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_40;
  RE2 *local_38;
  
  local_48 = star;
  local_38 = regex.ptr;
  pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  EVar1 = (pPVar9->super_BaseExpression).expression_class;
  if (EVar1 != OPERATOR) {
    if (EVar1 == FUNCTION) {
      local_50 = this;
      local_40 = expr;
      pBVar10 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(expr)->super_BaseExpression;
      pFVar11 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar10);
      local_78._M_dataplus._M_p._0_4_ = 0;
      local_78._M_dataplus._M_p._4_4_ = 0;
      local_78._M_string_length._0_4_ = 0;
      local_78._M_string_length._4_4_ = 0;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      local_98._M_unused._M_object =
           (pFVar11->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98._8_8_ =
           (pFVar11->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (local_98._M_unused._M_object == (void *)local_98._8_8_) {
        local_78.field_2._M_allocated_capacity = (size_type)(pointer)0x0;
      }
      else {
        do {
          AddChild((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_98._M_unused._0_8_,(expression_list_t *)&local_78,star_list,local_48,
                   regex);
          local_98._M_unused._0_8_ = (undefined8)((long)local_98._M_unused._0_8_ + 8);
        } while (local_98._M_unused._M_object != (void *)local_98._8_8_);
        local_98._M_unused._M_object =
             (pFVar11->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_98._8_8_ =
             (pFVar11->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_88 = (pFVar11->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined4 *)
       &(pFVar11->children).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_78._M_dataplus._M_p._0_4_;
      *(undefined4 *)
       ((long)&(pFVar11->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4) = local_78._M_dataplus._M_p._4_4_;
      *(undefined4 *)
       &(pFVar11->children).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (undefined4)local_78._M_string_length;
      *(undefined4 *)
       ((long)&(pFVar11->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 4) = local_78._M_string_length._4_4_;
      (pFVar11->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_78.field_2._M_allocated_capacity;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_98);
      this = local_50;
      if ((pFVar11->order_bys).
          super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
          super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl !=
          (OrderModifier *)0x0) {
        this_01 = &pFVar11->order_bys;
        local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pOVar14 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  ::operator->(this_01);
        pOVar3 = (pOVar14->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pEVar6 = local_b8.
                 super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar7 = local_b8.
                 super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pOVar19 = (pOVar14->orders).
                       super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            local_b8.
            super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
            _M_impl.super__Vector_impl_data._M_start = pEVar6,
            local_b8.
            super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
            _M_impl.super__Vector_impl_data._M_finish = pEVar7, pOVar19 != pOVar3;
            pOVar19 = pOVar19 + 1) {
          AddChild(&pOVar19->expression,(expression_list_t *)&local_b8,star_list,local_48,regex);
          pEVar6 = local_b8.
                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pEVar7 = local_b8.
                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        pOVar14 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  ::operator->(this_01);
        this = local_50;
        if ((long)pEVar7 - (long)pEVar6 >> 3 !=
            (long)(pOVar14->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pOVar14->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4) {
          this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_98._M_unused._M_object = &local_88;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"*COLUMNS(...) is not supported in the order expression",""
                    );
          NotImplementedException::NotImplementedException(this_00,(string *)&local_98);
          __cxa_throw(this_00,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        if (local_b8.
            super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_b8.
            super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          __n = 0;
          do {
            pvVar15 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                    *)&local_b8,__n);
            pOVar14 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                      ::operator->(this_01);
            pvVar16 = vector<duckdb::OrderByNode,_true>::operator[](&pOVar14->orders,__n);
            _Var4._M_head_impl =
                 (pvVar15->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (pvVar15->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)0x0;
            _Var5._M_head_impl =
                 (pvVar16->expression).
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (pvVar16->expression).
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 _Var4._M_head_impl;
            if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
            }
            __n = __n + 1;
          } while (__n < (ulong)((long)local_b8.
                                       super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&local_b8);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_78);
      expr = local_40;
    }
LAB_00d7d7cf:
    pPVar17 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    local_98._8_8_ = 0;
    local_98._M_unused._M_object = operator_new(0x20);
    *(Binder **)local_98._M_unused._0_8_ = this;
    *(expression_list_t **)((long)local_98._M_unused._0_8_ + 8) = star_list;
    *(StarExpression **)((long)local_98._M_unused._0_8_ + 0x10) = local_48;
    *(RE2 ***)((long)local_98._M_unused._0_8_ + 0x18) = &local_38;
    local_80 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_unpacked_star_expression.cpp:122:53)>
               ::_M_invoke;
    local_88 = (pointer)::std::
                        _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_unpacked_star_expression.cpp:122:53)>
                        ::_M_manager;
    ParsedExpressionIterator::EnumerateChildren
              (pPVar17,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                        *)&local_98);
    if (local_88 != (pointer)0x0) {
      (*(code *)local_88)(&local_98,&local_98,3);
    }
    return;
  }
  pPVar17 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator*(expr);
  bVar8 = StarExpression::IsColumnsUnpacked(pPVar17);
  if (bVar8) {
    pBVar18 = (BinderException *)__cxa_allocate_exception(0x10);
    local_98._M_unused._M_object = &local_88;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"*COLUMNS() can not be used in this place","");
    BinderException::BinderException(pBVar18,(string *)&local_98);
    __cxa_throw(pBVar18,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_40 = expr;
  pBVar10 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(expr)->super_BaseExpression;
  pOVar12 = BaseExpression::Cast<duckdb::OperatorExpression>(pBVar10);
  local_98._0_3_ = 0x242398;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_98;
  ::std::vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>::vector
            (&local_b8,__l,(allocator_type *)&local_78);
  if (local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pvVar13 = vector<duckdb::ExpressionType,_true>::operator[]
                          ((vector<duckdb::ExpressionType,_true> *)&local_b8,__n_00);
      EVar2 = (pOVar12->super_ParsedExpression).super_BaseExpression.type;
      __n_00 = __n_00 + 1;
      if ((ulong)((long)local_b8.
                        super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8.
                       super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                       ._M_impl.super__Vector_impl_data._M_start) <= __n_00) break;
    } while (EVar2 != *pvVar13);
    if (EVar2 == *pvVar13) {
      local_78._M_dataplus._M_p._0_4_ = 0;
      local_78._M_dataplus._M_p._4_4_ = 0;
      local_78._M_string_length._0_4_ = 0;
      local_78._M_string_length._4_4_ = 0;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      child_00 = (pOVar12->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      puVar20 = (pOVar12->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (child_00 == puVar20) {
        local_78.field_2._M_allocated_capacity = (size_type)(pointer)0x0;
        local_50 = this;
      }
      else {
        local_50 = this;
        do {
          AddChild(child_00,(expression_list_t *)&local_78,star_list,local_48,regex);
          child_00 = child_00 + 1;
        } while (child_00 != puVar20);
        child_00 = (pOVar12->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar20 = (pOVar12->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_88 = (pOVar12->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined4 *)
       &(pOVar12->children).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_78._M_dataplus._M_p._0_4_;
      *(undefined4 *)
       ((long)&(pOVar12->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4) = local_78._M_dataplus._M_p._4_4_;
      *(undefined4 *)
       &(pOVar12->children).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (undefined4)local_78._M_string_length;
      *(undefined4 *)
       ((long)&(pOVar12->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 4) = local_78._M_string_length._4_4_;
      (pOVar12->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_78.field_2._M_allocated_capacity;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      local_98._M_unused._M_object = child_00;
      local_98._8_8_ = puVar20;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_98);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_78);
      this = local_50;
      expr = local_40;
      if (local_b8.
          super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        this = local_50;
        expr = local_40;
      }
      goto LAB_00d7d7cf;
    }
  }
  pBVar18 = (BinderException *)__cxa_allocate_exception(0x10);
  local_98._M_unused._M_object = &local_88;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"*COLUMNS() can not be used together with the \'%s\' operator","");
  EnumUtil::ToString<duckdb::ExpressionType>
            (&local_78,(pOVar12->super_ParsedExpression).super_BaseExpression.type);
  BinderException::BinderException<std::__cxx11::string>(pBVar18,(string *)&local_98,&local_78);
  __cxa_throw(pBVar18,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::ReplaceUnpackedStarExpression(unique_ptr<ParsedExpression> &expr, expression_list_t &star_list,
                                           StarExpression &star, optional_ptr<duckdb_re2::RE2> regex) {
	D_ASSERT(expr);
	auto expression_class = expr->GetExpressionClass();
	// Replace *COLUMNS(...) in the supported places
	switch (expression_class) {
	case ExpressionClass::FUNCTION: {
		ReplaceInFunction(expr, star_list, star, regex);
		break;
	}
	case ExpressionClass::OPERATOR: {
		if (StarExpression::IsColumnsUnpacked(*expr)) {
			throw BinderException("*COLUMNS() can not be used in this place");
		}
		ReplaceInOperator(expr, star_list, star, regex);
		break;
	}
	default: {
		break;
	}
	}

	// Visit the children of this expression, collecting the unpacked expressions
	ParsedExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<ParsedExpression> &child_expr) {
		ReplaceUnpackedStarExpression(child_expr, star_list, star, regex);
	});
}